

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void on_tcp_child_process_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined1 local_20 [16];
  
  if (nread < 0) {
    if (nread == -0xfff) {
      free(buf->base);
      return;
    }
    uVar2 = uv_strerror(nread & 0xffffffff);
    printf("error recving on tcp connection: %s\n",uVar2);
    abort();
  }
  if (nread == 0) {
    pcVar3 = "nread > 0";
    uVar2 = 0x27e;
  }
  else {
    pcVar3 = buf->base;
    iVar1 = bcmp("world\n",pcVar3,nread);
    if (iVar1 == 0) {
      on_pipe_read_called = on_pipe_read_called + 1;
      free(pcVar3);
      local_20 = uv_buf_init("hello again\n",0xc);
      iVar1 = uv_write(0x2b4e60,tcp,local_20,1,tcp_connection_write_cb);
      if (iVar1 == 0) {
        tcp_conn_read_cb_called = tcp_conn_read_cb_called + 1;
        return;
      }
      pcVar3 = "r == 0";
      uVar2 = 0x286;
    }
    else {
      pcVar3 = "memcmp(\"world\\n\", buf->base, nread) == 0";
      uVar2 = 0x27f;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void on_tcp_child_process_read(uv_stream_t* tcp,
                                      ssize_t nread,
                                      const uv_buf_t* buf) {
  uv_buf_t outbuf;
  int r;

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on tcp connection: %s\n", uv_strerror(nread));
    abort();
  }

  ASSERT(nread > 0);
  ASSERT(memcmp("world\n", buf->base, nread) == 0);
  on_pipe_read_called++;
  free(buf->base);

  /* Write to the socket */
  outbuf = uv_buf_init("hello again\n", 12);
  r = uv_write(&conn.tcp_write_req, tcp, &outbuf, 1, tcp_connection_write_cb);
  ASSERT(r == 0);

  tcp_conn_read_cb_called++;
}